

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O0

int main(int argc,PCH *argv)

{
  int iVar1;
  int er;
  string *er_1;
  w3Interp local_5c8;
  w3Export *local_580;
  w3Export *xport;
  size_t j;
  bool cgen;
  bool rust_gen;
  w3Export *pwStack_568;
  bool run_all_exports;
  size_t i;
  size_t file;
  undefined1 local_548 [8];
  w3Module module;
  PCH *argv_local;
  int argc_local;
  
  module.import_global_count = (size_t)argv;
  w3Module::w3Module((w3Module *)local_548);
  i = 1;
  pwStack_568 = (w3Export *)0x0;
  j._7_1_ = 0;
  j._6_1_ = 0;
  j._5_1_ = 0;
  if (argc < 0) {
    AssertFailed("argc >= 0");
  }
  for (pwStack_568 = (w3Export *)0x1; pwStack_568 < (w3Export *)(ulong)(uint)argc;
      pwStack_568 = (w3Export *)((long)&(pwStack_568->name).data + 1)) {
    iVar1 = strcmp(*(char **)(module.import_global_count + (long)pwStack_568 * 8),"--cgen");
    if (iVar1 == 0) {
      j._5_1_ = 1;
      if (pwStack_568 == (w3Export *)0x1) {
        i = 2;
      }
      else if (pwStack_568 == (w3Export *)0x2) {
        i = 1;
      }
    }
    iVar1 = strcmp(*(char **)(module.import_global_count + (long)pwStack_568 * 8),"--rust-gen");
    if (iVar1 == 0) {
      j._6_1_ = 1;
      if (pwStack_568 == (w3Export *)0x1) {
        i = 2;
      }
      else if (pwStack_568 == (w3Export *)0x2) {
        i = 1;
      }
    }
    else {
      iVar1 = strcmp(*(char **)(module.import_global_count + (long)pwStack_568 * 8),
                     "--run-all-exports");
      if (iVar1 == 0) {
        j._7_1_ = 1;
        if (pwStack_568 == (w3Export *)0x1) {
          i = 2;
        }
        else if (pwStack_568 == (w3Export *)0x2) {
          i = 1;
        }
      }
    }
  }
  w3Module::read_module((w3Module *)local_548,*(PCSTR *)(module.import_global_count + i * 8));
  if ((j._7_1_ & 1) != 0) {
    xport = (w3Export *)
            std::vector<w3Export,_std::allocator<w3Export>_>::size
                      ((vector<w3Export,_std::allocator<w3Export>_> *)
                       &module.globals.super__Vector_base<Global,_std::allocator<Global>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    for (pwStack_568 = (w3Export *)0x0; pwStack_568 < xport;
        pwStack_568 = (w3Export *)((long)&(pwStack_568->name).data + 1)) {
      local_580 = std::vector<w3Export,_std::allocator<w3Export>_>::operator[]
                            ((vector<w3Export,_std::allocator<w3Export>_> *)
                             &module.globals.super__Vector_base<Global,_std::allocator<Global>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)pwStack_568);
      if (local_580->tag == w3ImportTag_Function) {
        w3Interp::w3Interp(&local_5c8);
        w3Interp::interp(&local_5c8,(w3Module *)local_548,local_580);
        w3Interp::~w3Interp(&local_5c8);
      }
    }
  }
  if (((j._5_1_ & 1) != 0) || ((j._6_1_ & 1) != 0)) {
    WasmCGen::WasmCGen((WasmCGen *)&er_1);
    WasmCGen::interp((WasmCGen *)&er_1,(w3Module *)local_548,(w3Export *)0x0);
    WasmCGen::~WasmCGen((WasmCGen *)&er_1);
  }
  w3Module::~w3Module((w3Module *)local_548);
  return 0;
}

Assistant:

int
main (int argc, PCH* argv)
{
    if (IsDebuggerPresent ()) DebugBreak ();
#if 0 // test code TODO move it elsewhere? Or under a switch.
    printf ("3 %s\n", InstructionName (1));
    printf ("4 %s\n", InstructionName (0x44));
    char buf [99] = { 0 };
    uint32_t len;
#define Xd(x) printf ("%s %I64d\n", #x, x);
#define Xx(x) printf ("%s %I64x\n", #x, x);
#define Xs(x) len = x; buf [len] = 0; printf ("%s %s\n", #x, buf);
    Xd (UIntGetPrecision (0));
    Xd (UIntGetPrecision (1));
    Xd (UIntGetPrecision (0x2));
    Xd (UIntGetPrecision (0x2));
    Xd (UIntGetPrecision (0x7));
    Xd (UIntGetPrecision (0x8));
    Xd (IntGetPrecision (0));
    Xd (IntGetPrecision (1));
    Xd (IntGetPrecision (0x2));
    Xd (IntGetPrecision (0x2));
    Xd (IntGetPrecision (0x7));
    Xd (IntGetPrecision (0x8));
    Xd (IntGetPrecision (0));
    Xd (IntGetPrecision (-1));
    Xd (IntGetPrecision (-0x2));
    Xd (IntGetPrecision (-0x2));
    Xd (IntGetPrecision (-0x7));
    Xd (IntGetPrecision (-0x8));
    Xd (IntToDec_GetLength (0))
    Xd (IntToDec_GetLength (1))
    Xd (IntToDec_GetLength (2))
    Xd (IntToDec_GetLength (300))
    Xd (IntToDec_GetLength (-1))
    Xx (SignExtend (0xf, 0));
    Xx (SignExtend (0xf, 1));
    Xx (SignExtend (0xf, 2));
    Xx (SignExtend (0xf, 3));
    Xx (SignExtend (0xf, 4));
    Xx (SignExtend (0xf, 5));
    Xd (IntToHex_GetLength (0xffffffffa65304e4));
    Xd (IntToHex_GetLength (0xfffffffa65304e4));
    Xd (IntToHex_GetLength (-1));
    Xd (IntToHex_GetLength (-1ui64>>4));
    Xd (IntToHex_GetLength (0xf));
    Xd (IntToHex_GetLength (32767));
    Xd (IntToHex_GetLength (-32767));
    Xs (IntToHex (32767, buf));
    Xs (IntToHex (-32767, buf));
    Xs (IntToHex8 (0x123, buf));
    Xs (IntToHex8 (0xffffffffa65304e4, buf));
    Xs (IntToHex8 (-1, buf));
    Xs (IntToHex (0x1, buf));
    Xs (IntToHex (0x12, buf));
    Xs (IntToHex (0x123, buf));
    Xs (IntToHex (0x12345678, buf));
    Xs (IntToHex (-1, buf));
    Xd (IntToHex_GetLength (0x1));
    Xd (IntToHex_GetLength (0x12));
    Xd (IntToHex_GetLength (0x12345678));
    Xd (IntToHex_GetLength (0x01234567));
    Xd (IntToHex_GetLength (-1));
    Xd (IntToHex_GetLength (~0u >> 1));
    Xd (IntToHex_GetLength (~0u >> 2));
    Xd (IntToHex_GetLength (~0u >> 4));
    exit (0);
#endif
#if 1
    try
#endif
    {
        // FIXME command line parsing
        // FIXME verbosity
        w3Module module;

        // Support --run-all-exports for wabt test suite.

        size_t file = 1;
        size_t i = 0;
        bool run_all_exports = 0;
        bool rust_gen = 0;
        bool cgen = 0;

        Assert(argc >= 0);
        for (i = 1 ; i < (uint32_t)argc; ++i)
        {
            if (strcmp (argv [i], "--cgen") == 0)
            {
                cgen = true;
                if (i == 1)
                    file = 2;
                else if (i == 2)
                    file = 1;
            }
            if (strcmp (argv [i], "--rust-gen") == 0)
            {
                rust_gen = true;
                if (i == 1)
                    file = 2;
                else if (i == 2)
                    file = 1;
            }
            else if (strcmp (argv [i], "--run-all-exports") == 0)
            {
                run_all_exports = true;
                if (i == 1)
                    file = 2;
                else if (i == 2)
                    file = 1;
            }
        }

        module.read_module (argv [file]);

        if (run_all_exports)
        {
            const size_t j = module.exports.size ();
            for (i = 0; i < j; ++i)
            {
                w3Export* const xport = &module.exports [i];
                if (xport->tag != w3ExportTag_Function)
                    continue;
                w3Interp().interp (&module, xport);
            }
        }

        if (cgen || rust_gen)
        {
            WasmCGen().interp (&module);
        }
    }
#if 1
    catch (int er)
    {
        fprintf (stderr, "error 0x%08X\n", er);
    }
    catch (const std::string& er)
    {
        fprintf (stderr, "%s", er.c_str ());
    }
#endif
    return 0;
}